

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void * __thiscall duckdb_re2::Prog::PrefixAccel_ShiftDFA(Prog *this,void *data,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong in_RDX;
  byte *pbVar8;
  uint64_t in_RSI;
  long in_RDI;
  uint64_t next4;
  uint64_t next3;
  uint64_t next2;
  uint64_t next1;
  uint64_t next0;
  uint8_t b7;
  uint8_t b6;
  uint8_t b5;
  uint8_t b4;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  uint8_t b0;
  uint8_t *endp_1;
  uint8_t *p_1;
  uint64_t curr;
  byte *local_c8;
  uint64_t next;
  uint8_t b;
  uint8_t *endp;
  uint8_t *p;
  uint64_t curr7;
  uint64_t curr6;
  uint64_t curr5;
  uint64_t curr4;
  uint64_t curr3;
  uint64_t curr2;
  uint64_t curr1;
  uint64_t curr0;
  uint64_t next7;
  uint64_t next6;
  uint64_t next5;
  
  if (in_RDX < *(ulong *)(in_RDI + 0x20)) {
    next5 = 0;
  }
  else {
    curr1 = 0;
    curr0 = in_RDX;
    next7 = in_RSI;
    if (7 < in_RDX) {
      curr2 = in_RSI;
      do {
        uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)curr2 * 8) >>
                ((byte)curr1 & 0x3f);
        uVar2 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 1) * 8) >>
                ((byte)uVar1 & 0x3f);
        uVar3 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 2) * 8) >>
                ((byte)uVar2 & 0x3f);
        uVar4 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 3) * 8) >>
                ((byte)uVar3 & 0x3f);
        uVar5 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 4) * 8) >>
                ((byte)uVar4 & 0x3f);
        uVar6 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 5) * 8) >>
                ((byte)uVar5 & 0x3f);
        uVar7 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 6) * 8) >>
                ((byte)uVar6 & 0x3f);
        curr1 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*(byte *)(curr2 + 7) * 8) >>
                ((byte)uVar7 & 0x3f);
        if ((curr1 & 0x3f) == 0x36) {
          if ((curr1 - uVar1 & 0x3f) == 0) {
            return (void *)((curr2 + 1) - *(long *)(in_RDI + 0x20));
          }
          if ((curr1 - uVar2 & 0x3f) == 0) {
            return (void *)((curr2 + 2) - *(long *)(in_RDI + 0x20));
          }
          if ((curr1 - uVar3 & 0x3f) == 0) {
            return (void *)((curr2 + 3) - *(long *)(in_RDI + 0x20));
          }
          if ((curr1 - uVar4 & 0x3f) != 0) {
            if ((curr1 - uVar5 & 0x3f) == 0) {
              return (void *)((curr2 + 5) - *(long *)(in_RDI + 0x20));
            }
            if ((curr1 - uVar6 & 0x3f) != 0) {
              if ((curr1 - uVar7 & 0x3f) != 0) {
                return (void *)((curr2 + 8) - *(long *)(in_RDI + 0x20));
              }
              return (void *)((curr2 + 7) - *(long *)(in_RDI + 0x20));
            }
            return (void *)((curr2 + 6) - *(long *)(in_RDI + 0x20));
          }
          return (void *)((curr2 + 4) - *(long *)(in_RDI + 0x20));
        }
        curr2 = curr2 + 8;
      } while (curr2 != in_RSI + (in_RDX & 0xfffffffffffffff8));
      curr0 = in_RDX & 7;
      next7 = curr2;
    }
    local_c8 = (byte *)next7;
    do {
      if (local_c8 == (byte *)(next7 + curr0)) {
        return (void *)0x0;
      }
      pbVar8 = local_c8 + 1;
      curr1 = *(ulong *)(*(long *)(in_RDI + 0x28) + (ulong)*local_c8 * 8) >> ((byte)curr1 & 0x3f);
      local_c8 = pbVar8;
    } while ((curr1 & 0x3f) != 0x36);
    next5 = (long)pbVar8 - *(long *)(in_RDI + 0x20);
  }
  return (void *)next5;
}

Assistant:

const void* Prog::PrefixAccel_ShiftDFA(const void* data, size_t size) {
  if (size < prefix_size_)
    return NULL;

  uint64_t curr = 0;

  // At the time of writing, rough benchmarks on a Broadwell machine showed
  // that this unroll factor (i.e. eight) achieves a speedup factor of two.
  if (size >= 8) {
    const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
    const uint8_t* endp = p + (size&~7);
    do {
      uint8_t b0 = p[0];
      uint8_t b1 = p[1];
      uint8_t b2 = p[2];
      uint8_t b3 = p[3];
      uint8_t b4 = p[4];
      uint8_t b5 = p[5];
      uint8_t b6 = p[6];
      uint8_t b7 = p[7];

      uint64_t next0 = prefix_dfa_[b0];
      uint64_t next1 = prefix_dfa_[b1];
      uint64_t next2 = prefix_dfa_[b2];
      uint64_t next3 = prefix_dfa_[b3];
      uint64_t next4 = prefix_dfa_[b4];
      uint64_t next5 = prefix_dfa_[b5];
      uint64_t next6 = prefix_dfa_[b6];
      uint64_t next7 = prefix_dfa_[b7];

      uint64_t curr0 = next0 >> (curr  & 63);
      uint64_t curr1 = next1 >> (curr0 & 63);
      uint64_t curr2 = next2 >> (curr1 & 63);
      uint64_t curr3 = next3 >> (curr2 & 63);
      uint64_t curr4 = next4 >> (curr3 & 63);
      uint64_t curr5 = next5 >> (curr4 & 63);
      uint64_t curr6 = next6 >> (curr5 & 63);
      uint64_t curr7 = next7 >> (curr6 & 63);

      if ((curr7 & 63) == kShiftDFAFinal * 6) {
        // At the time of writing, using the same masking subexpressions from
        // the preceding lines caused Clang to clutter the hot loop computing
        // them - even though they aren't actually needed for shifting! Hence
        // these rewritten conditions, which achieve a speedup factor of two.
        if (((curr7-curr0) & 63) == 0) return p+1-prefix_size_;
        if (((curr7-curr1) & 63) == 0) return p+2-prefix_size_;
        if (((curr7-curr2) & 63) == 0) return p+3-prefix_size_;
        if (((curr7-curr3) & 63) == 0) return p+4-prefix_size_;
        if (((curr7-curr4) & 63) == 0) return p+5-prefix_size_;
        if (((curr7-curr5) & 63) == 0) return p+6-prefix_size_;
        if (((curr7-curr6) & 63) == 0) return p+7-prefix_size_;
        if (((curr7-curr7) & 63) == 0) return p+8-prefix_size_;
      }

      curr = curr7;
      p += 8;
    } while (p != endp);
    data = p;
    size = size&7;
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* endp = p + size;
  while (p != endp) {
    uint8_t b = *p++;
    uint64_t next = prefix_dfa_[b];
    curr = next >> (curr & 63);
    if ((curr & 63) == kShiftDFAFinal * 6)
      return p-prefix_size_;
  }
  return NULL;
}